

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_EmboldenXY(FT_Outline *outline,FT_Pos xstrength,FT_Pos ystrength)

{
  FT_Vector *pFVar1;
  FT_Orientation FVar2;
  int iVar3;
  FT_UInt32 FVar4;
  long a_;
  long a__00;
  FT_Long FVar5;
  FT_Long FVar6;
  long b_;
  FT_Orientation local_f0;
  FT_Orientation local_ec;
  FT_Long local_d8;
  FT_Orientation local_bc;
  FT_Orientation local_b8;
  FT_Int k;
  FT_Int j;
  FT_Int i;
  FT_Fixed d;
  FT_Fixed q;
  FT_Fixed l;
  FT_Fixed l_anchor;
  FT_Fixed l_out;
  FT_Fixed l_in;
  FT_Vector shift;
  FT_Vector anchor;
  FT_Vector out;
  FT_Vector in;
  FT_Orientation orientation;
  FT_Int last;
  FT_Int first;
  FT_Int c;
  FT_Vector *points;
  FT_Pos ystrength_local;
  FT_Pos xstrength_local;
  FT_Outline *outline_local;
  
  if (outline == (FT_Outline *)0x0) {
    outline_local._4_4_ = 0x14;
  }
  else {
    a_ = xstrength / 2;
    a__00 = ystrength / 2;
    if ((a_ == 0) && (a__00 == 0)) {
      outline_local._4_4_ = 0;
    }
    else {
      FVar2 = FT_Outline_Get_Orientation(outline);
      if (FVar2 == FT_ORIENTATION_NONE) {
        if (outline->n_contours == 0) {
          outline_local._4_4_ = 0;
        }
        else {
          outline_local._4_4_ = 6;
        }
      }
      else {
        pFVar1 = outline->points;
        orientation = FT_ORIENTATION_FILL_RIGHT;
        for (last = 0; last < outline->n_contours; last = last + 1) {
          l = 0;
          l_out = 0;
          iVar3 = (int)outline->contours[last];
          anchor.x = 0;
          shift.y = 0;
          in.x = 0;
          out.y = 0;
          local_bc = ~FT_ORIENTATION_FILL_RIGHT;
          local_b8 = orientation;
          k = iVar3;
          while (local_b8 != k && k != local_bc) {
            if (local_b8 == local_bc) {
              anchor.y = shift.y;
              out.x = anchor.x;
              l_anchor = l;
LAB_002df525:
              if (l_out == 0) {
                k = local_b8;
              }
              else {
                if ((int)local_bc < 0) {
                  local_bc = k;
                  shift.y = out.y;
                  anchor.x = in.x;
                  l = l_out;
                }
                FVar5 = FT_MulFix(out.y,anchor.y);
                FVar6 = FT_MulFix(in.x,out.x);
                if (FVar5 + FVar6 < -0xefff) {
                  shift.x = 0;
                  l_in = 0;
                }
                else {
                  b_ = FVar5 + FVar6 + 0x10000;
                  l_in = in.x + out.x;
                  shift.x = out.y + anchor.y;
                  if (FVar2 == FT_ORIENTATION_FILL_RIGHT) {
                    l_in = -l_in;
                  }
                  else {
                    shift.x = -shift.x;
                  }
                  FVar5 = FT_MulFix(anchor.y,in.x);
                  FVar6 = FT_MulFix(out.x,out.y);
                  d = FVar5 - FVar6;
                  if (FVar2 == FT_ORIENTATION_FILL_RIGHT) {
                    d = -d;
                  }
                  if ((ulong)l_out < (ulong)l_anchor) {
                    local_d8 = l_out;
                  }
                  else {
                    local_d8 = l_anchor;
                  }
                  FVar5 = FT_MulFix(a_,d);
                  FVar6 = FT_MulFix(local_d8,b_);
                  if (FVar6 < FVar5) {
                    l_in = FT_MulDiv(l_in,local_d8,d);
                  }
                  else {
                    l_in = FT_MulDiv(l_in,a_,b_);
                  }
                  FVar5 = FT_MulFix(a__00,d);
                  FVar6 = FT_MulFix(local_d8,b_);
                  if (FVar6 < FVar5) {
                    shift.x = FT_MulDiv(shift.x,local_d8,d);
                  }
                  else {
                    shift.x = FT_MulDiv(shift.x,a__00,b_);
                  }
                }
                while (k != local_b8) {
                  pFVar1[k].x = a_ + l_in + pFVar1[k].x;
                  pFVar1[k].y = a__00 + shift.x + pFVar1[k].y;
                  if (k < iVar3) {
                    local_ec = k + FT_ORIENTATION_FILL_LEFT;
                  }
                  else {
                    local_ec = orientation;
                  }
                  k = local_ec;
                }
              }
              out.y = anchor.y;
              in.x = out.x;
              l_out = l_anchor;
            }
            else {
              anchor.y = pFVar1[(int)local_b8].x - pFVar1[k].x;
              out.x = pFVar1[(int)local_b8].y - pFVar1[k].y;
              FVar4 = FT_Vector_NormLen((FT_Vector *)&anchor.y);
              l_anchor = (FT_Fixed)FVar4;
              if (l_anchor != 0) goto LAB_002df525;
            }
            if ((int)local_b8 < iVar3) {
              local_f0 = local_b8 + FT_ORIENTATION_FILL_LEFT;
            }
            else {
              local_f0 = orientation;
            }
            local_b8 = local_f0;
          }
          orientation = iVar3 + FT_ORIENTATION_FILL_LEFT;
        }
        outline_local._4_4_ = 0;
      }
    }
  }
  return outline_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_EmboldenXY( FT_Outline*  outline,
                         FT_Pos       xstrength,
                         FT_Pos       ystrength )
  {
    FT_Vector*      points;
    FT_Int          c, first, last;
    FT_Orientation  orientation;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    xstrength /= 2;
    ystrength /= 2;
    if ( xstrength == 0 && ystrength == 0 )
      return FT_Err_Ok;

    orientation = FT_Outline_Get_Orientation( outline );
    if ( orientation == FT_ORIENTATION_NONE )
    {
      if ( outline->n_contours )
        return FT_THROW( Invalid_Argument );
      else
        return FT_Err_Ok;
    }

    points = outline->points;

    first = 0;
    for ( c = 0; c < outline->n_contours; c++ )
    {
      FT_Vector  in, out, anchor, shift;
      FT_Fixed   l_in, l_out, l_anchor = 0, l, q, d;
      FT_Int     i, j, k;


      l_in = 0;
      last = outline->contours[c];

      /* pacify compiler */
      in.x = in.y = anchor.x = anchor.y = 0;

      /* Counter j cycles though the points; counter i advances only  */
      /* when points are moved; anchor k marks the first moved point. */
      for ( i = last, j = first, k = -1;
            j != i && i != k;
            j = j < last ? j + 1 : first )
      {
        if ( j != k )
        {
          out.x = points[j].x - points[i].x;
          out.y = points[j].y - points[i].y;
          l_out = (FT_Fixed)FT_Vector_NormLen( &out );

          if ( l_out == 0 )
            continue;
        }
        else
        {
          out   = anchor;
          l_out = l_anchor;
        }

        if ( l_in != 0 )
        {
          if ( k < 0 )
          {
            k        = i;
            anchor   = in;
            l_anchor = l_in;
          }

          d = FT_MulFix( in.x, out.x ) + FT_MulFix( in.y, out.y );

          /* shift only if turn is less than ~160 degrees */
          if ( d > -0xF000L )
          {
            d = d + 0x10000L;

            /* shift components along lateral bisector in proper orientation */
            shift.x = in.y + out.y;
            shift.y = in.x + out.x;

            if ( orientation == FT_ORIENTATION_TRUETYPE )
              shift.x = -shift.x;
            else
              shift.y = -shift.y;

            /* restrict shift magnitude to better handle collapsing segments */
            q = FT_MulFix( out.x, in.y ) - FT_MulFix( out.y, in.x );
            if ( orientation == FT_ORIENTATION_TRUETYPE )
              q = -q;

            l = FT_MIN( l_in, l_out );

            /* non-strict inequalities avoid divide-by-zero when q == l == 0 */
            if ( FT_MulFix( xstrength, q ) <= FT_MulFix( l, d ) )
              shift.x = FT_MulDiv( shift.x, xstrength, d );
            else
              shift.x = FT_MulDiv( shift.x, l, q );


            if ( FT_MulFix( ystrength, q ) <= FT_MulFix( l, d ) )
              shift.y = FT_MulDiv( shift.y, ystrength, d );
            else
              shift.y = FT_MulDiv( shift.y, l, q );
          }
          else
            shift.x = shift.y = 0;

          for ( ;
                i != j;
                i = i < last ? i + 1 : first )
          {
            points[i].x += xstrength + shift.x;
            points[i].y += ystrength + shift.y;
          }
        }
        else
          i = j;

        in   = out;
        l_in = l_out;
      }

      first = last + 1;
    }

    return FT_Err_Ok;
  }